

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::DrawTestBase::setup2x2Viewport(DrawTestBase *this,PROVOKING_VERTEX provoking)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *this_00;
  undefined4 local_90;
  GLenum mode;
  uint local_84;
  GLuint x;
  GLuint y;
  GLfloat height;
  GLfloat width;
  GLfloat data [16];
  int local_30;
  ApiType local_2c;
  GLint index;
  ContextType *context_type;
  Functions *gl;
  DrawTestBase *pDStack_10;
  PROVOKING_VERTEX provoking_local;
  DrawTestBase *this_local;
  
  gl._4_4_ = provoking;
  pDStack_10 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  context_type = (ContextType *)CONCAT44(extraout_var,iVar2);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  local_2c.m_bits = (*pRVar4->_vptr_RenderContext[2])();
  _index = &local_2c;
  local_30 = 0;
  for (local_84 = 0; local_84 < 2; local_84 = local_84 + 1) {
    for (mode = 0; mode < 2; mode = mode + 1) {
      (&height)[local_30 << 2] = (float)mode * 64.0;
      (&height)[local_30 * 4 + 1] = (float)local_84 * 64.0;
      (&height)[local_30 * 4 + 2] = 64.0;
      (&height)[local_30 * 4 + 3] = 64.0;
      local_30 = local_30 + 1;
    }
  }
  (**(code **)(context_type + 0x682))(0,4,&height);
  dVar3 = (**(code **)(context_type + 0x200))();
  glu::checkError(dVar3,"ViewportArrayv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0xccd);
  bVar1 = glu::isContextTypeGLCore((ContextType)_index->m_bits);
  if (bVar1) {
    if (gl._4_4_ == FIRST) {
      local_90 = 0x8e4d;
    }
    else {
      if (gl._4_4_ != LAST) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                   ,0xcdb);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_90 = 0x8e4e;
    }
    (**(code **)(context_type + 0x47c))(local_90);
    dVar3 = (**(code **)(context_type + 0x200))();
    glu::checkError(dVar3,"ProvokingVertex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xcdf);
  }
  return;
}

Assistant:

void DrawTestBase::setup2x2Viewport(PROVOKING_VERTEX provoking)
{
	const glw::Functions&   gl			 = m_context.getRenderContext().getFunctions();
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	GLint   index = 0;
	GLfloat data[4 * 4 /* 4x4 * (x + y + w + h) */];

	GLfloat width  = (GLfloat)(m_width / 2);
	GLfloat height = (GLfloat)(m_height / 2);

	for (GLuint y = 0; y < 2; ++y)
	{
		for (GLuint x = 0; x < 2; ++x)
		{
			data[index * 4 + 0] = (GLfloat)((GLfloat)x * width);
			data[index * 4 + 1] = (GLfloat)((GLfloat)y * height);
			data[index * 4 + 2] = width;
			data[index * 4 + 3] = height;

			index += 1;
		}
	}

	gl.viewportArrayv(0 /* first */, 4 /*count */, data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportArrayv");

	if (glu::isContextTypeGLCore(context_type))
	{
		GLenum mode = 0;
		switch (provoking)
		{
		case FIRST:
			mode = GL_FIRST_VERTEX_CONVENTION;
			break;
		case LAST:
			mode = GL_LAST_VERTEX_CONVENTION;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		gl.provokingVertex(mode);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ProvokingVertex");
	}
	else
	{
		/* can't control the provoking vertex in ES yet - it stays as LAST */
		DE_ASSERT(glu::isContextTypeES(context_type));
		DE_UNREF(provoking);
	}
}